

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O3

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTechnique
          (OgreImporter *this,string *techniqueName,stringstream *ss,aiMaterial *material)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  char cVar2;
  int iVar3;
  Logger *pLVar4;
  bool bVar5;
  undefined1 newlines;
  long lVar6;
  _Alloc_hider _Var7;
  string passName;
  string linePart;
  string partPass;
  string local_218;
  undefined1 *local_1f8;
  size_t local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined8 local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  OgreImporter *local_1b8;
  aiMaterial *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1f8 = &local_1e8;
  local_1f0 = 0;
  local_1e8 = 0;
  local_1b8 = this;
  local_1b0 = material;
  std::operator>>((istream *)ss,(string *)&local_1f8);
  if (local_1f0 == DAT_008de148) {
    if (local_1f0 == 0) {
LAB_004af52f:
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[13]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [13])" technique \'");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(techniqueName->_M_dataplus)._M_p,
                 techniqueName->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar4,local_218._M_dataplus._M_p);
      paVar1 = &local_218.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"pass","");
LAB_004af5f4:
      if (local_1f0 == DAT_008de168) {
        if (local_1f0 == 0) goto LAB_004af744;
        iVar3 = bcmp(local_1f8,partBlockEnd_abi_cxx11_,local_1f0);
        if (iVar3 == 0) goto LAB_004af744;
      }
      std::operator>>((istream *)ss,(string *)&local_1f8);
      __n = local_1f0;
      if (local_1f0 == DAT_008de128) {
        if (local_1f0 != 0) {
          iVar3 = bcmp(local_1f8,partComment_abi_cxx11_,local_1f0);
          if (iVar3 != 0) goto LAB_004af662;
        }
        local_1d0 = 0;
        local_1c8._M_local_buf[0] = '\0';
        local_1d8 = &local_1c8;
        cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)ss,(string *)&local_1d8,cVar2);
        if (local_1d8 != &local_1c8) {
          lVar6 = CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]);
          _Var7._M_p = (pointer)local_1d8;
LAB_004af737:
          operator_delete(_Var7._M_p,lVar6 + 1);
        }
        goto LAB_004af5f4;
      }
LAB_004af662:
      if (__n == local_1a8._8_8_) {
        if (__n != 0) {
          iVar3 = bcmp(local_1f8,(void *)local_1a8._0_8_,__n);
          if (iVar3 != 0) goto LAB_004af5f4;
        }
        local_218._M_string_length = 0;
        local_218.field_2._M_local_buf[0] = '\0';
        local_218._M_dataplus._M_p = (pointer)paVar1;
        cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
        newlines = (char)&local_218;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)ss,(string *)&local_218,cVar2);
        Trim(&local_218,(bool)newlines);
        ReadPass(local_1b8,&local_218,ss,local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) {
          lVar6 = CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                           local_218.field_2._M_local_buf[0]);
          _Var7._M_p = local_218._M_dataplus._M_p;
          goto LAB_004af737;
        }
      }
      goto LAB_004af5f4;
    }
    iVar3 = bcmp(local_1f8,partBlockStart_abi_cxx11_,local_1f0);
    if (iVar3 == 0) goto LAB_004af52f;
  }
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[60]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [60])"Invalid material: Technique block start missing near index ");
  std::istream::tellg();
  std::ostream::_M_insert<long>((long)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::error(pLVar4,local_218._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  bVar5 = false;
  goto LAB_004af768;
LAB_004af744:
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar5 = true;
LAB_004af768:
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  return bVar5;
}

Assistant:

bool OgreImporter::ReadTechnique(const std::string &techniqueName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Technique block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F(" technique '", techniqueName, "'");

    const string partPass  = "pass";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        /// @todo Techniques have other attributes than just passes.
        if (linePart == partPass)
        {
            string passName = SkipLine(ss);
            ReadPass(Trim(passName), ss, material);
        }
    }
    return true;
}